

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O1

int __thiscall mpt::layout::open(layout *this,char *__file,int __oflag,...)

{
  int iVar1;
  undefined8 in_RAX;
  config_parser *this_00;
  
  if (this->_parse != (parser *)0x0) {
LAB_00137cc8:
    iVar1 = (*this->_parse->_vptr_parser[4])(this->_parse,__file);
    return iVar1;
  }
  if (__file == (char *)0x0) {
    iVar1 = (int)CONCAT71((int7)((ulong)in_RAX >> 8),1);
  }
  else {
    this_00 = (config_parser *)operator_new(0x50);
    config_parser::config_parser(this_00);
    this->_parse = (parser *)this_00;
    iVar1 = (*(this_00->super_parser)._vptr_parser[3])(this_00,"{*} =;#! \'\"");
    if ((char)iVar1 != '\0') goto LAB_00137cc8;
    if (this->_parse != (parser *)0x0) {
      (*this->_parse->_vptr_parser[1])();
    }
    this->_parse = (parser *)0x0;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

bool layout::open(const char *fn)
{
	if (!_parse) {
		if (!fn) {
			return true;
		}
		_parse = new config_parser;
		if (!_parse->set_format(file_format())) {
			delete _parse;
			_parse = nullptr;
			return false;
		}
	}
	return _parse->open(fn);
}